

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

bool __thiscall QDir::makeAbsolute(QDir *this)

{
  QAbstractFileEngine *pQVar1;
  _Head_base<0UL,_QDirPrivate_*,_false> ptr;
  bool bVar2;
  QDirPrivate *pQVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  _Head_base<0UL,_QDirPrivate_*,_false> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QSharedDataPointer<QDirPrivate>::data(&this->d_ptr);
  local_28._M_head_impl = (QDirPrivate *)0x0;
  pQVar1 = (pQVar3->fileEngine)._M_t.
           super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
           _M_t.
           super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
           super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
  if (pQVar1 == (QAbstractFileEngine *)0x0) {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QDirPrivate::resolveAbsoluteEntry((QString *)&local_48,pQVar3);
    pQVar3 = (QDirPrivate *)operator_new(0x118);
    QDirPrivate::QDirPrivate(pQVar3,(this->d_ptr).d.ptr);
    std::__uniq_ptr_impl<QDirPrivate,_std::default_delete<QDirPrivate>_>::reset
              ((__uniq_ptr_impl<QDirPrivate,_std::default_delete<QDirPrivate>_> *)&local_28,pQVar3);
    QDirPrivate::setPath(local_28._M_head_impl,(QString *)&local_48);
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    (*pQVar1->_vptr_QAbstractFileEngine[0x19])(&local_48,pQVar1,3);
    bVar2 = isRelativePath((QString *)&local_48);
    if (bVar2) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      bVar2 = false;
      goto LAB_00213c7a;
    }
    pQVar3 = (QDirPrivate *)operator_new(0x118);
    QDirPrivate::QDirPrivate(pQVar3,(this->d_ptr).d.ptr);
    std::__uniq_ptr_impl<QDirPrivate,_std::default_delete<QDirPrivate>_>::reset
              ((__uniq_ptr_impl<QDirPrivate,_std::default_delete<QDirPrivate>_> *)&local_28,pQVar3);
    QDirPrivate::setPath(local_28._M_head_impl,(QString *)&local_48);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  ptr._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (QDirPrivate *)0x0;
  QSharedDataPointer<QDirPrivate>::reset(&this->d_ptr,ptr._M_head_impl);
  bVar2 = true;
LAB_00213c7a:
  std::unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_>::~unique_ptr
            ((unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_> *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QDir::makeAbsolute()
{
    Q_D(const QDir);
    std::unique_ptr<QDirPrivate> dir;
    if (!!d->fileEngine) {
        QString absolutePath = d->fileEngine->fileName(QAbstractFileEngine::AbsoluteName);
        if (QDir::isRelativePath(absolutePath))
            return false;

        dir.reset(new QDirPrivate(*d_ptr.constData()));
        dir->setPath(absolutePath);
    } else { // native FS
        QString absoluteFilePath = d->resolveAbsoluteEntry();
        dir.reset(new QDirPrivate(*d_ptr.constData()));
        dir->setPath(absoluteFilePath);
    }
    d_ptr = dir.release(); // actually detach
    return true;
}